

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<bool>::Set(RepeatedField<bool> *this,int index,bool *value)

{
  bool bVar1;
  LogMessage *pLVar2;
  bool *pbVar3;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  bool *local_20;
  bool *value_local;
  RepeatedField<bool> *pRStack_10;
  int index_local;
  RepeatedField<bool> *this_local;
  
  local_59 = 0;
  local_20 = value;
  value_local._4_4_ = index;
  pRStack_10 = this;
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x29b);
    local_59 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(local_6d,pLVar2);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  local_a9 = 0;
  if (this->current_size_ <= value_local._4_4_) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x29c);
    local_a9 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_aa,pLVar2);
  }
  if ((local_a9 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a8);
  }
  bVar1 = *local_20;
  pbVar3 = elements(this);
  pbVar3[value_local._4_4_] = (bool)(bVar1 & 1);
  return;
}

Assistant:

inline void RepeatedField<Element>::Set(int index, const Element& value) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  elements()[index] = value;
}